

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_mvcp(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  int r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_l1,FLD_C_b4);
  gen_helper_mvcp(tcg_ctx_00,tcg_ctx_00->cc_op,tcg_ctx_00->cpu_env,tcg_ctx_00->regs[iVar1],o->addr1,
                  o->in2);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_mvcp(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, l1);
    gen_helper_mvcp(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, tcg_ctx->regs[r1], o->addr1, o->in2);
    set_cc_static(s);
    return DISAS_NEXT;
}